

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_container_is_subset(bitset_container_t *container1,bitset_container_t *container2)

{
  int local_24;
  int32_t i;
  bitset_container_t *container2_local;
  bitset_container_t *container1_local;
  
  if (((container1->cardinality == -1) || (container2->cardinality == -1)) ||
     (container1->cardinality <= container2->cardinality)) {
    for (local_24 = 0; local_24 < 0x400; local_24 = local_24 + 1) {
      if ((container1->words[local_24] & container2->words[local_24]) != container1->words[local_24]
         ) {
        return false;
      }
    }
    container1_local._7_1_ = true;
  }
  else {
    container1_local._7_1_ = false;
  }
  return container1_local._7_1_;
}

Assistant:

bool bitset_container_is_subset(const bitset_container_t *container1,
                          const bitset_container_t *container2) {
    if((container1->cardinality != BITSET_UNKNOWN_CARDINALITY) && (container2->cardinality != BITSET_UNKNOWN_CARDINALITY)) {
        if(container1->cardinality > container2->cardinality) {
            return false;
        }
    }
    for(int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
		if((container1->words[i] & container2->words[i]) != container1->words[i]) {
			return false;
		}
	}
	return true;
}